

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O3

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CIdExp *expression)

{
  ISubtreeWrapper *pIVar1;
  __buckets_ptr pp_Var2;
  IAddress *pIVar3;
  ISubtreeWrapper *pIVar4;
  shared_ptr<VariableInfo> varInfo;
  __buckets_ptr local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"IRT builder: CIdExp\n",0x14);
  pIVar3 = IRT::CFrame::GetLocalVisibilityAddress(this->currentFrame,&expression->name);
  if (pIVar3 != (IAddress *)0x0) {
    pIVar4 = (ISubtreeWrapper *)operator_new(0x10);
    (*pIVar3->_vptr_IAddress[2])(&stack0xffffffffffffffd0,pIVar3);
    pp_Var2 = local_30;
    local_30 = (__buckets_ptr)0x0;
    pIVar4->_vptr_ISubtreeWrapper = (_func_int **)&PTR_ToExpression_00181498;
    pIVar4[1]._vptr_ISubtreeWrapper = (_func_int **)pp_Var2;
    pIVar1 = (this->wrapper)._M_t.
             super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>
             .super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl;
    (this->wrapper)._M_t.
    super___uniq_ptr_impl<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>._M_t.
    super__Tuple_impl<0UL,_IRT::ISubtreeWrapper_*,_std::default_delete<IRT::ISubtreeWrapper>_>.
    super__Head_base<0UL,_IRT::ISubtreeWrapper_*,_false>._M_head_impl = pIVar4;
    if (pIVar1 != (ISubtreeWrapper *)0x0) {
      operator_delete(pIVar1);
      if (local_30 != (__buckets_ptr)0x0) {
        (*(code *)(*local_30)[2]._M_nxt)();
      }
    }
    getVariableInfoFromLocalArgAndFields
              ((SymbolTable *)&stack0xffffffffffffffd0,(string *)this->symbolTable,
               &this->currentClassName,&this->currentMethod);
    if (*(char *)&local_30[4]->_M_nxt == '\x01') {
      std::__cxx11::string::_M_replace
                ((ulong)&this->currentObjectClassName,0,
                 (char *)(this->currentObjectClassName)._M_string_length,0x15a41a);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->currentObjectClassName);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    return;
  }
  __assert_fail("address != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CBuildVisitor.cpp"
                ,0x11,"virtual void CBuildVisitor::Visit(CIdExp &)");
}

Assistant:

void CBuildVisitor::Visit( CIdExp &expression ) {
    std::cout << "IRT builder: CIdExp\n";
    const IRT::IAddress *address = currentFrame->GetLocalVisibilityAddress( expression.name );

    assert( address != NULL );

    updateSubtreeWrapper( new IRT::CExpressionWrapper(
            std::move( address->ToExpression( ))
    ));

    auto varInfo = getVariableInfoFromLocalArgAndFields( symbolTable, currentClassName, currentMethod,
                                                         expression.name );
    if ( varInfo->type->isPrimitive ) {
        currentObjectClassName = "";
    } else {
        currentObjectClassName = varInfo->type->className;
    }
}